

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_char(lua_State *L)

{
  char *pcVar1;
  lua_Integer lVar2;
  int c;
  char *p;
  luaL_Buffer b;
  int i;
  int n;
  lua_State *L_local;
  
  b.initb._8188_4_ = lua_gettop(L);
  pcVar1 = luaL_buffinitsize(L,(luaL_Buffer *)&p,(long)(int)b.initb._8188_4_);
  b.initb[0x1ff8] = '\x01';
  b.initb[0x1ff9] = '\0';
  b.initb[0x1ffa] = '\0';
  b.initb[0x1ffb] = '\0';
  for (; (int)b.initb._8184_4_ <= (int)b.initb._8188_4_; b.initb._8184_4_ = b.initb._8184_4_ + 1) {
    lVar2 = luaL_checkinteger(L,b.initb._8184_4_);
    if (((uint)lVar2 & 0xff) != (uint)lVar2) {
      luaL_argerror(L,b.initb._8184_4_,"value out of range");
    }
    pcVar1[b.initb._8184_4_ + -1] = (char)lVar2;
  }
  luaL_pushresultsize((luaL_Buffer *)&p,(long)(int)b.initb._8188_4_);
  return 1;
}

Assistant:

static int str_char (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  int i;
  luaL_Buffer b;
  char *p = luaL_buffinitsize(L, &b, n);
  for (i=1; i<=n; i++) {
    int c = luaL_checkint(L, i);
    luaL_argcheck(L, uchar(c) == c, i, "value out of range");
    p[i - 1] = uchar(c);
  }
  luaL_pushresultsize(&b, n);
  return 1;
}